

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_work_stealing.cpp
# Opt level: O0

void continuation(size_t W)

{
  code *pcVar1;
  byte extraout_AL;
  Enum EVar2;
  Executor *__stat_loc;
  ResultBuilder *in_RDI;
  double __x;
  Expression_lhs<const_int_&> EVar3;
  size_t i;
  ResultBuilder DOCTEST_RB;
  int w;
  Task prev;
  Task curr;
  Executor executor;
  Taskflow taskflow;
  nullptr_t in_stack_fffffffffffffc78;
  Result *res;
  Taskflow *in_stack_fffffffffffffc80;
  undefined4 in_stack_fffffffffffffc88;
  undefined4 uVar4;
  int in_stack_fffffffffffffc8c;
  char *in_stack_fffffffffffffc90;
  Taskflow *in_stack_fffffffffffffca0;
  Executor *in_stack_fffffffffffffcb0;
  anon_class_24_3_f08794bc *in_stack_fffffffffffffcc0;
  FlowBuilder *in_stack_fffffffffffffcc8;
  Task local_318;
  ulong local_310;
  undefined4 local_304;
  undefined4 in_stack_fffffffffffffd0c;
  ExpressionDecomposer local_2ec;
  int *local_2e8;
  Enum local_2e0;
  shared_ptr<tf::WorkerInterface> *in_stack_fffffffffffffd68;
  size_t in_stack_fffffffffffffd70;
  undefined8 in_stack_fffffffffffffd78;
  Task local_238;
  Task local_230 [5];
  Executor local_208;
  ResultBuilder *local_8;
  
  local_8 = in_RDI;
  tf::Taskflow::Taskflow(in_stack_fffffffffffffca0);
  std::shared_ptr<tf::WorkerInterface>::shared_ptr
            ((shared_ptr<tf::WorkerInterface> *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78)
  ;
  tf::Executor::Executor
            ((Executor *)in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,
             in_stack_fffffffffffffd68);
  std::shared_ptr<tf::WorkerInterface>::~shared_ptr((shared_ptr<tf::WorkerInterface> *)0x11bfb5);
  tf::Task::Task(local_230);
  tf::Task::Task(&local_238);
  EVar2 = tf::Executor::this_worker_id(&local_208);
  res = (Result *)0x18308d;
  doctest::detail::ResultBuilder::ResultBuilder
            (local_8,EVar2,in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c,
             (char *)in_stack_fffffffffffffc80,"",(char *)in_stack_fffffffffffffcb0);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_2ec,DT_REQUIRE);
  EVar3 = doctest::detail::ExpressionDecomposer::operator<<<int,_nullptr>
                    ((ExpressionDecomposer *)in_stack_fffffffffffffc80,(int *)res);
  local_2e8 = EVar3.lhs;
  EVar2 = EVar3.m_at;
  local_304 = 0xffffffff;
  local_2e0 = EVar2;
  doctest::detail::Expression_lhs<int_const&>::operator==
            ((Expression_lhs<const_int_&> *)CONCAT44(in_stack_fffffffffffffd0c,EVar2),local_2e8);
  doctest::detail::ResultBuilder::setResult((ResultBuilder *)in_stack_fffffffffffffc80,res);
  doctest::detail::Result::~Result((Result *)0x11c0d9);
  doctest::detail::ResultBuilder::log((ResultBuilder *)&stack0xfffffffffffffd48,__x);
  uVar4 = CONCAT13(extraout_AL,(int3)in_stack_fffffffffffffc88);
  if ((extraout_AL & 1) == 0) {
    doctest::detail::ResultBuilder::react((ResultBuilder *)in_stack_fffffffffffffc80);
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x11c1ee);
    for (local_310 = 0; local_310 < 1000; local_310 = local_310 + 1) {
      tf::FlowBuilder::
      emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_work_stealing_cpp:1008:29),_nullptr>
                (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
      tf::Task::operator=(local_230,&local_318);
      if (local_310 != 0) {
        tf::Task::precede<tf::Task&>((Task *)in_stack_fffffffffffffc80,(Task *)res);
      }
      tf::Task::operator=(&local_238,local_230);
    }
    __stat_loc = &local_208;
    tf::Executor::run((Executor *)CONCAT44(EVar2,uVar4),in_stack_fffffffffffffc80);
    std::__basic_future<void>::wait((__basic_future<void> *)&stack0xfffffffffffffcb0,__stat_loc);
    tf::Future<void>::~Future((Future<void> *)in_stack_fffffffffffffc80);
    tf::Executor::~Executor(in_stack_fffffffffffffcb0);
    tf::Taskflow::~Taskflow(in_stack_fffffffffffffc80);
    return;
  }
  pcVar1 = (code *)swi(3);
  (*pcVar1)();
  return;
}

Assistant:

void continuation(size_t W) {
  
  tf::Taskflow taskflow;
  tf::Executor executor(W);
  
  tf::Task curr, prev;

  int w = executor.this_worker_id();

  REQUIRE(w == -1);

  for(size_t i=0; i<1000; i++) {
    curr = taskflow.emplace([&, i]() mutable {
      if(i == 0) {
        w = executor.this_worker_id();
      } 
      else {
        REQUIRE(w == executor.this_worker_id());
      }
    });

    if(i) {
      prev.precede(curr);
    }

    prev = curr;
  }

  executor.run(taskflow).wait();

}